

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::MVNParameter::InternalSerializeWithCachedSizesToArray
          (MVNParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar2;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (1,this->normalize_variance_,target);
  }
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (2,this->across_channels_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(3,this->eps_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = MVNParameter::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* MVNParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.MVNParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool normalize_variance = 1 [default = true];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(1, this->normalize_variance(), target);
  }

  // optional bool across_channels = 2 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->across_channels(), target);
  }

  // optional float eps = 3 [default = 1e-09];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->eps(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.MVNParameter)
  return target;
}